

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O3

void duckdb::ConcatFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  char cVar1;
  VectorType VVar2;
  VectorType VVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  list_entry_t *plVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  undefined1 (*pauVar8) [16];
  void *pvVar9;
  byte bVar10;
  undefined1 auVar11 [16];
  size_t sVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  BoundFunctionExpression *pBVar16;
  pointer pFVar17;
  Vector *child_vec;
  idx_t iVar18;
  TemplatedValidityData<unsigned_long> *pTVar19;
  reference pvVar20;
  reference vector;
  ulong uVar21;
  reference pvVar22;
  pointer pVVar23;
  uint *puVar24;
  data_ptr_t pdVar25;
  _Head_base<0UL,_unsigned_long_*,_false> _Var26;
  pointer pLVar27;
  size_type sVar28;
  pointer pVVar29;
  ValidityMask *pVVar30;
  data_ptr_t pdVar31;
  idx_t len;
  pointer pLVar32;
  pointer pLVar33;
  undefined1 auVar34 [8];
  ulong uVar35;
  SelectionVector *pSVar36;
  uint uVar37;
  long lVar38;
  undefined1 *puVar39;
  char *pcVar40;
  void *pvVar41;
  idx_t idx_in_entry;
  ulong uVar42;
  data_ptr_t pdVar43;
  undefined1 *puVar44;
  data_ptr_t pdVar45;
  ulong uVar46;
  size_type sVar47;
  data_ptr_t pdVar48;
  uint uVar49;
  ulong uVar50;
  size_type sVar51;
  string_t sVar52;
  char *a_data_1;
  string_t target_7;
  char *a_data;
  vector<duckdb::ListConcatInputData,_true> input_data;
  string_t target;
  undefined1 local_1a8 [8];
  pointer pLStack_1a0;
  pointer local_198;
  data_ptr_t local_190;
  pointer local_188;
  pointer local_180;
  data_ptr_t local_178;
  ValidityMask *local_170;
  ulong local_168;
  pointer local_160;
  size_t local_158;
  ulong local_150;
  undefined1 local_148 [8];
  pointer pLStack_140;
  pointer local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_f8 [16];
  unsigned_long *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  UnifiedVectorFormat local_a0;
  list_entry_t *local_58;
  undefined8 local_50;
  void *local_48;
  undefined8 local_40;
  data_ptr_t local_38;
  
  pBVar16 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar17 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar16->bind_info);
  cVar1 = *(char *)&pFVar17[4]._vptr_FunctionData;
  if (*(char *)&pFVar17[1]._vptr_FunctionData == 'e') {
    local_198 = (pointer)args->count;
    local_188 = (pointer)result->data;
    local_148 = (undefined1  [8])0x0;
    pLStack_140 = (pointer)0x0;
    local_138 = (pointer)0x0;
    pVVar23 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar29 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pVVar23 != pVVar29) {
      do {
        if ((cVar1 != '\0') || ((pVVar23->type).id_ != SQLNULL)) {
          child_vec = ListVector::GetEntry(pVVar23);
          ListConcatInputData::ListConcatInputData
                    ((ListConcatInputData *)local_f8,pVVar23,child_vec);
          Vector::ToUnifiedFormat(pVVar23,(idx_t)local_198,(UnifiedVectorFormat *)local_f8);
          local_58 = (list_entry_t *)local_f8._8_8_;
          iVar18 = ListVector::GetListSize(pVVar23);
          Vector::ToUnifiedFormat(child_vec,iVar18,&local_a0);
          ::std::vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>::
          emplace_back<duckdb::ListConcatInputData>
                    ((vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                      *)local_148,(ListConcatInputData *)local_f8);
          if (local_a0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
          }
          if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
          }
        }
        pVVar23 = pVVar23 + 1;
      } while (pVVar23 != pVVar29);
    }
    FlatVector::VerifyFlatVector(result);
    if (local_198 == (pointer)0x0) {
      iVar18 = 0;
    }
    else {
      local_160 = (pointer)&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data;
      iVar18 = 0;
      uVar46 = 0;
      pLVar27 = local_188;
      do {
        pLVar33 = pLStack_140;
        lVar38 = uVar46 * 0x10;
        *(idx_t *)((long)pLVar27 + lVar38) = iVar18;
        pdVar43 = (data_ptr_t)((long)pLVar27 + lVar38 + 8);
        pdVar43[0] = '\0';
        pdVar43[1] = '\0';
        pdVar43[2] = '\0';
        pdVar43[3] = '\0';
        pdVar43[4] = '\0';
        pdVar43[5] = '\0';
        pdVar43[6] = '\0';
        pdVar43[7] = '\0';
        if (local_148 == (undefined1  [8])pLStack_140) {
          lVar38 = 0;
        }
        else {
          local_190 = (data_ptr_t)(uVar46 >> 6);
          bVar10 = (byte)uVar46 & 0x3f;
          local_180 = (pointer)(-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
          auVar34 = local_148;
          pLVar32 = pLVar27;
          do {
            psVar4 = ((((pointer)auVar34)->vdata).sel)->sel_vector;
            uVar21 = uVar46;
            if (psVar4 != (sel_t *)0x0) {
              uVar21 = (ulong)psVar4[uVar46];
            }
            puVar5 = (((pointer)auVar34)->vdata).validity.super_TemplatedValidityMask<unsigned_long>
                     .validity_mask;
            if ((puVar5 == (unsigned_long *)0x0) ||
               ((puVar5[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) {
              plVar6 = ((pointer)auVar34)->input_entries;
              *(long *)((long)pLVar27 + lVar38 + 8) =
                   *(long *)((long)pLVar27 + lVar38 + 8) + plVar6[uVar21].length;
              ListVector::Append(result,((pointer)auVar34)->child_vec,
                                 (((pointer)auVar34)->child_vdata).sel,
                                 plVar6[uVar21].length + plVar6[uVar21].offset,plVar6[uVar21].offset
                                );
            }
            else if (cVar1 != '\0') {
              _Var26._M_head_impl =
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (_Var26._M_head_impl == (unsigned_long *)0x0) {
                local_1a8 = (undefined1  [8])
                            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_f8,(unsigned_long *)local_1a8);
                uVar13 = local_f8._0_8_;
                uVar14 = local_f8._8_8_;
                local_f8 = ZEXT816(0);
                p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)uVar13;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14;
                if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
                  }
                }
                pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)local_160);
                _Var26._M_head_impl =
                     (pTVar19->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var26._M_head_impl;
                pLVar32 = local_188;
              }
              _Var26._M_head_impl[(long)local_190] =
                   _Var26._M_head_impl[(long)local_190] & (ulong)local_180;
            }
            auVar34 = (undefined1  [8])((long)auVar34 + 0xa8);
          } while (auVar34 != (undefined1  [8])pLVar33);
          lVar38 = *(long *)((long)pLVar27 + lVar38 + 8);
          pLVar27 = pLVar32;
        }
        iVar18 = lVar38 + iVar18;
        uVar46 = uVar46 + 1;
      } while ((pointer)uVar46 != local_198);
    }
    ListVector::SetListSize(result,iVar18);
    bVar15 = DataChunk::AllConstant(args);
    if (bVar15) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    ::std::vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>::
    ~vector((vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_> *)
            local_148);
  }
  else {
    if (cVar1 != '\0') {
      pvVar20 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
      vector = vector<duckdb::Vector,_true>::operator[](&args->data,1);
      VVar2 = pvVar20->vector_type;
      VVar3 = vector->vector_type;
      if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
        puVar5 = (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pauVar8 = (undefined1 (*) [16])vector->data;
        pdVar43 = result->data;
        if (((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) &&
           ((puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
            puVar5 == (unsigned_long *)0x0 || ((*puVar5 & 1) != 0)))) {
          local_148 = *(undefined1 (*) [8])pvVar20->data;
          pLStack_140 = *(pointer *)((long)pvVar20->data + 8);
          _local_1a8 = *(anon_union_16_2_67f50693_for_value *)pauVar8;
          pLVar27 = pLStack_140;
          if (SUB84(local_148,0) < 0xd) {
            pLVar27 = (pointer)(local_148 + 4);
          }
          puVar44 = *(undefined1 **)(*pauVar8 + 8);
          if ((uint)*(ulong *)*pauVar8 < 0xd) {
            puVar44 = local_1a8 + 4;
          }
          uVar46 = (ulong)local_148 & 0xffffffff;
          uVar21 = *(ulong *)*pauVar8 & 0xffffffff;
          local_f8 = (undefined1  [16])
                     StringVector::EmptyString
                               ((StringVector *)result,(Vector *)(uVar46 + uVar21),(idx_t)local_148)
          ;
          puVar39 = local_f8._8_8_;
          if (local_f8._0_4_ < 0xd) {
            puVar39 = local_f8 + 4;
          }
          switchD_012b9b0d::default(puVar39,pLVar27,uVar46);
          switchD_012b9b0d::default(puVar39 + uVar46,puVar44,uVar21);
          uVar46 = (ulong)(uint)local_f8._0_4_;
          if (uVar46 < 0xd) {
            switchD_012e3010::default(local_f8 + 4 + uVar46,0,0xc - uVar46);
          }
          else {
            local_f8._4_4_ = *(undefined4 *)local_f8._8_8_;
          }
          *(undefined8 *)pdVar43 = local_f8._0_8_;
          *(undefined8 *)(pdVar43 + 8) = local_f8._8_8_;
          return;
        }
      }
      else {
        pdVar43 = (data_ptr_t)args->count;
        local_178 = pdVar43;
        if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          local_170 = (ValidityMask *)vector->data;
          puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          local_190 = pvVar20->data;
          if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
            Vector::SetVectorType(result,FLAT_VECTOR);
            local_180 = (pointer)result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(pvVar20);
            FlatVector::VerifyFlatVector(result);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       &(pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                      );
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (pdVar43 == (data_ptr_t)0x0) {
                return;
              }
              uVar46 = *(ulong *)&local_170->super_TemplatedValidityMask<unsigned_long>;
              local_198 = *(pointer *)
                           ((long)&local_170->super_TemplatedValidityMask<unsigned_long> + 8);
              pLVar27 = (pointer)(local_1a8 + 4);
              if (0xc < (uint)uVar46) {
                pLVar27 = local_198;
              }
              lVar38 = 8;
              pLVar33 = pLVar27;
              do {
                local_148 = *(undefined1 (*) [8])(local_190 + lVar38 + -8);
                pLStack_140 = *(pointer *)(local_190 + lVar38);
                pLStack_1a0 = local_198;
                local_1a8 = (undefined1  [8])uVar46;
                pLVar32 = pLStack_140;
                if (SUB84(local_148,0) < 0xd) {
                  pLVar32 = (pointer)(local_148 + 4);
                }
                uVar21 = (ulong)local_148 & 0xffffffff;
                local_f8 = (undefined1  [16])
                           StringVector::EmptyString
                                     ((StringVector *)result,
                                      (Vector *)((uVar46 & 0xffffffff) + uVar21),(idx_t)pLVar33);
                pcVar40 = local_f8._8_8_;
                if (local_f8._0_4_ < 0xd) {
                  pcVar40 = local_f8 + 4;
                }
                switchD_012b9b0d::default(pcVar40,pLVar32,uVar21);
                switchD_012b9b0d::default(pcVar40 + uVar21,pLVar27,uVar46 & 0xffffffff);
                uVar21 = (ulong)(uint)local_f8._0_4_;
                if (uVar21 < 0xd) {
                  switchD_012e3010::default(local_f8 + 4 + uVar21,0,0xc - uVar21);
                  pdVar43 = (data_ptr_t)local_f8._8_8_;
                }
                else {
                  local_f8._4_4_ = *(undefined4 *)local_f8._8_8_;
                  pdVar43 = (data_ptr_t)local_f8._8_8_;
                }
                *(undefined8 *)((long)local_180 + lVar38 + -8) = local_f8._0_8_;
                *(data_ptr_t *)
                 ((long)&((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           *)&(local_180->vdata).sel)->_M_ptr + lVar38) = pdVar43;
                lVar38 = lVar38 + 0x10;
                local_178 = local_178 + -1;
                pLVar33 = local_180;
              } while (local_178 != (data_ptr_t)0x0);
              return;
            }
            if (pdVar43 + 0x3f < (data_ptr_t)0x40) {
              return;
            }
            uVar46 = (ulong)(pdVar43 + 0x3f) >> 6;
            local_168 = 0;
            pdVar43 = (data_ptr_t)0x0;
            local_150 = uVar46;
            do {
              puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                local_198 = (pointer)(pdVar43 + 0x40);
                if (local_178 <= pdVar43 + 0x40) {
                  local_198 = (pointer)local_178;
                }
LAB_010e3526:
                pLVar33 = (pointer)pdVar43;
                if (pdVar43 < local_198) {
                  uVar21 = *(ulong *)&local_170->super_TemplatedValidityMask<unsigned_long>;
                  local_188 = *(pointer *)
                               ((long)&local_170->super_TemplatedValidityMask<unsigned_long> + 8);
                  local_160 = local_188;
                  if ((uint)uVar21 < 0xd) {
                    local_160 = (pointer)(local_1a8 + 4);
                  }
                  local_158 = uVar21 & 0xffffffff;
                  uVar35 = (long)pdVar43 << 4 | 8;
                  pLVar27 = local_160;
                  do {
                    sVar12 = local_158;
                    local_148 = *(undefined1 (*) [8])(local_190 + (uVar35 - 8));
                    pLStack_140 = *(pointer *)(local_190 + uVar35);
                    pLStack_1a0 = local_188;
                    local_1a8 = (undefined1  [8])uVar21;
                    pLVar33 = pLStack_140;
                    if (SUB84(local_148,0) < 0xd) {
                      pLVar33 = (pointer)(local_148 + 4);
                    }
                    uVar46 = (ulong)local_148 & 0xffffffff;
                    local_f8 = (undefined1  [16])
                               StringVector::EmptyString
                                         ((StringVector *)result,(Vector *)(local_158 + uVar46),
                                          (idx_t)pLVar27);
                    pcVar40 = local_f8._8_8_;
                    if (local_f8._0_4_ < 0xd) {
                      pcVar40 = local_f8 + 4;
                    }
                    switchD_012b9b0d::default(pcVar40,pLVar33,uVar46);
                    switchD_012b9b0d::default(pcVar40 + uVar46,local_160,sVar12);
                    uVar46 = (ulong)(uint)local_f8._0_4_;
                    if (uVar46 < 0xd) {
                      switchD_012e3010::default(local_f8 + 4 + uVar46,0,0xc - uVar46);
                      pdVar48 = (data_ptr_t)local_f8._8_8_;
                    }
                    else {
                      local_f8._4_4_ = *(undefined4 *)local_f8._8_8_;
                      pdVar48 = (data_ptr_t)local_f8._8_8_;
                    }
                    *(undefined8 *)((long)local_180 + (uVar35 - 8)) = local_f8._0_8_;
                    *(data_ptr_t *)
                     ((long)&((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               *)&(local_180->vdata).sel)->_M_ptr + uVar35) = pdVar48;
                    pdVar43 = pdVar43 + 1;
                    uVar35 = uVar35 + 0x10;
                    uVar46 = local_150;
                    pLVar27 = local_180;
                    pLVar33 = local_198;
                  } while (local_198 != (pointer)pdVar43);
                }
              }
              else {
                pLVar27 = (pointer)puVar5[local_168];
                local_198 = (pointer)(pdVar43 + 0x40);
                if (local_178 <= pdVar43 + 0x40) {
                  local_198 = (pointer)local_178;
                }
                pLVar33 = local_198;
                if (pLVar27 != (pointer)0x0) {
                  if (pLVar27 == (pointer)0xffffffffffffffff) goto LAB_010e3526;
                  uVar21 = (long)local_198 - (long)pdVar43;
                  pLVar33 = (pointer)pdVar43;
                  if (pdVar43 < local_198) {
                    uVar42 = (long)pdVar43 << 4 | 8;
                    uVar35 = 0;
                    local_188 = pLVar27;
                    do {
                      if (((ulong)pLVar27 >> (uVar35 & 0x3f) & 1) != 0) {
                        local_148 = *(undefined1 (*) [8])(local_190 + (uVar42 - 8));
                        pLStack_140 = *(pointer *)(local_190 + uVar42);
                        _local_1a8 = *(anon_union_16_2_67f50693_for_value *)local_170;
                        pLVar27 = pLStack_140;
                        if (SUB84(local_148,0) < 0xd) {
                          pLVar27 = (pointer)(local_148 + 4);
                        }
                        puVar44 = *(undefined1 **)
                                   ((long)&local_170->super_TemplatedValidityMask<unsigned_long> + 8
                                   );
                        if ((uint)*(ulong *)&local_170->super_TemplatedValidityMask<unsigned_long> <
                            0xd) {
                          puVar44 = local_1a8 + 4;
                        }
                        uVar50 = (ulong)local_148 & 0xffffffff;
                        uVar46 = *(ulong *)&local_170->super_TemplatedValidityMask<unsigned_long> &
                                 0xffffffff;
                        local_f8 = (undefined1  [16])
                                   StringVector::EmptyString
                                             ((StringVector *)result,(Vector *)(uVar46 + uVar50),
                                              (idx_t)(local_1a8 + 4));
                        puVar39 = local_f8._8_8_;
                        if (local_f8._0_4_ < 0xd) {
                          puVar39 = local_f8 + 4;
                        }
                        switchD_012b9b0d::default(puVar39,pLVar27,uVar50);
                        switchD_012b9b0d::default(puVar39 + uVar50,puVar44,uVar46);
                        uVar46 = (ulong)(uint)local_f8._0_4_;
                        if (uVar46 < 0xd) {
                          switchD_012e3010::default(local_f8 + uVar46 + 4,0,0xc - uVar46);
                          pdVar43 = (data_ptr_t)local_f8._8_8_;
                        }
                        else {
                          local_f8._4_4_ = *(undefined4 *)local_f8._8_8_;
                          pdVar43 = (data_ptr_t)local_f8._8_8_;
                        }
                        *(undefined8 *)((long)local_180 + (uVar42 - 8)) = local_f8._0_8_;
                        *(data_ptr_t *)
                         ((long)&((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                   *)&(local_180->vdata).sel)->_M_ptr + uVar42) = pdVar43;
                        pLVar27 = local_188;
                      }
                      uVar35 = uVar35 + 1;
                      uVar42 = uVar42 + 0x10;
                      uVar46 = local_150;
                      pLVar33 = local_198;
                    } while (uVar21 != uVar35);
                  }
                }
              }
              local_168 = local_168 + 1;
              pdVar43 = (data_ptr_t)pLVar33;
              if (local_168 == uVar46) {
                return;
              }
            } while( true );
          }
        }
        else {
          if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
            if (VVar3 != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
              UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_f8);
              UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_148);
              Vector::ToUnifiedFormat(pvVar20,(idx_t)pdVar43,(UnifiedVectorFormat *)local_f8);
              Vector::ToUnifiedFormat(vector,(idx_t)pdVar43,(UnifiedVectorFormat *)local_148);
              Vector::SetVectorType(result,FLAT_VECTOR);
              pdVar48 = result->data;
              local_180 = (pointer)local_f8._8_8_;
              local_198 = pLStack_140;
              FlatVector::VerifyFlatVector(result);
              if (local_138 == (pointer)0x0 && local_e8 == (unsigned_long *)0x0) {
                if (pdVar43 != (data_ptr_t)0x0) {
                  psVar4 = *(sel_t **)local_f8._0_8_;
                  local_188 = (pointer)((UnifiedVectorFormat *)local_148)->sel;
                  pdVar48 = pdVar48 + 8;
                  pdVar43 = (data_ptr_t)0x0;
                  do {
                    pdVar45 = pdVar43;
                    if (psVar4 != (sel_t *)0x0) {
                      pdVar45 = (data_ptr_t)(ulong)psVar4[(long)pdVar43];
                    }
                    pdVar25 = pdVar43;
                    if (local_188 != (pointer)0x0) {
                      pdVar25 = (data_ptr_t)
                                (ulong)*(uint *)((long)&local_188->vdata + (long)pdVar43 * 4);
                    }
                    local_50 = *(ulong *)((long)local_180 + (long)pdVar45 * 0x10);
                    pvVar9 = *(void **)((long)local_180 + (long)pdVar45 * 0x10 + 8);
                    local_40 = (&(local_198->vdata).sel)[(long)pdVar25 * 2];
                    pdVar45 = (&(local_198->vdata).data)[(long)pdVar25 * 2];
                    uVar49 = (uint)local_50;
                    uVar46 = local_50 & 0xffffffff;
                    uVar37 = (uint)local_40;
                    uVar21 = (ulong)local_40 & 0xffffffff;
                    local_190 = pdVar43;
                    local_48 = pvVar9;
                    local_38 = pdVar45;
                    _local_1a8 = (anon_struct_16_3_d7536bce_for_pointer)
                                 StringVector::EmptyString
                                           ((StringVector *)result,(Vector *)(uVar21 + uVar46),
                                            (idx_t)local_180);
                    pdVar43 = (data_ptr_t)((long)&local_40 + 4);
                    if (0xc < uVar37) {
                      pdVar43 = pdVar45;
                    }
                    pvVar41 = (void *)((long)&local_50 + 4);
                    if (0xc < uVar49) {
                      pvVar41 = pvVar9;
                    }
                    puVar44 = local_1a8 + 4;
                    if (0xc < local_1a8._0_4_) {
                      puVar44 = local_1a8._8_8_;
                    }
                    switchD_012b9b0d::default(puVar44,pvVar41,uVar46);
                    switchD_012b9b0d::default(puVar44 + uVar46,pdVar43,uVar21);
                    uVar46 = (ulong)(uint)local_1a8._0_4_;
                    if (uVar46 < 0xd) {
                      switchD_012e3010::default(local_1a8 + uVar46 + 4,0,0xc - uVar46);
                      pLVar27 = pLStack_1a0;
                    }
                    else {
                      local_1a8._4_4_ = *(undefined4 *)pLStack_1a0;
                      pLVar27 = pLStack_1a0;
                    }
                    *(undefined1 (*) [8])(pdVar48 + -8) = local_1a8;
                    *(pointer *)pdVar48 = pLVar27;
                    pdVar43 = local_190 + 1;
                    pdVar48 = pdVar48 + 0x10;
                  } while (local_178 != pdVar43);
                }
              }
              else if (pdVar43 != (data_ptr_t)0x0) {
                psVar4 = *(sel_t **)local_f8._0_8_;
                pLVar27 = (pointer)((UnifiedVectorFormat *)local_148)->sel;
                local_160 = (pointer)&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data;
                pdVar48 = pdVar48 + 8;
                pdVar45 = (data_ptr_t)0x0;
                local_188 = pLVar27;
                do {
                  pdVar25 = pdVar45;
                  if (psVar4 != (sel_t *)0x0) {
                    pdVar25 = (data_ptr_t)(ulong)psVar4[(long)pdVar45];
                  }
                  pdVar31 = pdVar45;
                  if (pLVar27 != (pointer)0x0) {
                    pdVar31 = (data_ptr_t)
                              (ulong)*(uint *)((long)&((SelectionVector *)pLVar27)->sel_vector +
                                              (long)pdVar45 * 4);
                  }
                  if (((local_e8 == (unsigned_long *)0x0) ||
                      ((local_e8[(ulong)pdVar25 >> 6] >> ((ulong)pdVar25 & 0x3f) & 1) != 0)) &&
                     ((local_138 == (pointer)0x0 ||
                      (((ulong)(&(local_138->vdata).sel)[(ulong)pdVar31 >> 6] >>
                        ((ulong)pdVar31 & 0x3f) & 1) != 0)))) {
                    local_50 = *(ulong *)((long)local_180 + (long)pdVar25 * 0x10);
                    pvVar9 = *(void **)((long)local_180 + (long)pdVar25 * 0x10 + 8);
                    local_40 = (&(local_198->vdata).sel)[(long)pdVar31 * 2];
                    pdVar25 = (&(local_198->vdata).data)[(long)pdVar31 * 2];
                    uVar49 = (uint)local_50;
                    uVar46 = local_50 & 0xffffffff;
                    uVar37 = (uint)local_40;
                    local_190 = (data_ptr_t)((ulong)local_40 & 0xffffffff);
                    local_48 = pvVar9;
                    local_38 = pdVar25;
                    _local_1a8 = (anon_struct_16_3_d7536bce_for_pointer)
                                 StringVector::EmptyString
                                           ((StringVector *)result,(Vector *)(local_190 + uVar46),
                                            (idx_t)local_180);
                    pdVar43 = local_178;
                    pdVar31 = (data_ptr_t)((long)&local_40 + 4);
                    if (0xc < uVar37) {
                      pdVar31 = pdVar25;
                    }
                    pvVar41 = (void *)((long)&local_50 + 4);
                    if (0xc < uVar49) {
                      pvVar41 = pvVar9;
                    }
                    pcVar40 = local_1a8 + 4;
                    if (0xc < local_1a8._0_4_) {
                      pcVar40 = local_1a8._8_8_;
                    }
                    switchD_012b9b0d::default(pcVar40,pvVar41,uVar46);
                    switchD_012b9b0d::default(pcVar40 + uVar46,pdVar31,(size_t)local_190);
                    uVar46 = (ulong)(uint)local_1a8._0_4_;
                    if (uVar46 < 0xd) {
                      switchD_012e3010::default(local_1a8 + uVar46 + 4,0,0xc - uVar46);
                      pLVar27 = pLStack_1a0;
                    }
                    else {
                      local_1a8._4_4_ = *(undefined4 *)pLStack_1a0;
                      pLVar27 = pLStack_1a0;
                    }
                    *(undefined1 (*) [8])(pdVar48 + -8) = local_1a8;
                    *(pointer *)pdVar48 = pLVar27;
                    pLVar27 = local_188;
                  }
                  else {
                    _Var26._M_head_impl =
                         (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                    ;
                    if (_Var26._M_head_impl == (unsigned_long *)0x0) {
                      local_50 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                                 capacity;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)local_1a8,&local_50);
                      auVar34 = local_1a8;
                      pLVar27 = pLStack_1a0;
                      _local_1a8 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
                      p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data.internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)auVar34;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar27;
                      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                        if (pLStack_1a0 != (pointer)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_1a0);
                        }
                      }
                      pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                            *)local_160);
                      _Var26._M_head_impl =
                           (pTVar19->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                           _Var26._M_head_impl;
                      pLVar27 = local_188;
                      pdVar43 = local_178;
                    }
                    bVar10 = (byte)pdVar45 & 0x3f;
                    _Var26._M_head_impl[(ulong)pdVar45 >> 6] =
                         _Var26._M_head_impl[(ulong)pdVar45 >> 6] &
                         (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
                  }
                  pdVar45 = pdVar45 + 1;
                  pdVar48 = pdVar48 + 0x10;
                } while (pdVar43 != pdVar45);
              }
              if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_pi);
              }
              if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128._M_pi);
              }
              if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
              }
              if (local_d8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                return;
              }
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
              return;
            }
            local_190 = pvVar20->data;
            local_180 = (pointer)vector->data;
            Vector::SetVectorType(result,FLAT_VECTOR);
            local_198 = (pointer)result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(pvVar20);
            FlatVector::VerifyFlatVector(result);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       &(pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                      );
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            FlatVector::VerifyFlatVector(vector);
            local_170 = &result->validity;
            ValidityMask::Combine(&result->validity,&vector->validity,(idx_t)pdVar43);
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (pdVar43 == (data_ptr_t)0x0) {
                return;
              }
              lVar38 = 8;
              do {
                local_148 = *(undefined1 (*) [8])(local_190 + lVar38 + -8);
                pLStack_140 = *(pointer *)(local_190 + lVar38);
                uVar46 = *(ulong *)((long)local_180 + lVar38 + -8);
                pLVar27 = pLStack_140;
                if (SUB84(local_148,0) < 0xd) {
                  pLVar27 = (pointer)(local_148 + 4);
                }
                pLStack_1a0 = (pointer)*(undefined1 **)((long)local_180 + lVar38);
                local_1a8 = (undefined1  [8])uVar46;
                puVar44 = *(undefined1 **)((long)local_180 + lVar38);
                if ((uint)uVar46 < 0xd) {
                  puVar44 = local_1a8 + 4;
                }
                uVar21 = (ulong)local_148 & 0xffffffff;
                local_f8 = (undefined1  [16])
                           StringVector::EmptyString
                                     ((StringVector *)result,
                                      (Vector *)(uVar21 + (uVar46 & 0xffffffff)),
                                      (idx_t)(local_1a8 + 4));
                pcVar40 = local_f8._8_8_;
                if (local_f8._0_4_ < 0xd) {
                  pcVar40 = local_f8 + 4;
                }
                switchD_012b9b0d::default(pcVar40,pLVar27,uVar21);
                switchD_012b9b0d::default(pcVar40 + uVar21,puVar44,uVar46 & 0xffffffff);
                uVar46 = (ulong)(uint)local_f8._0_4_;
                if (uVar46 < 0xd) {
                  switchD_012e3010::default(local_f8 + uVar46 + 4,0,0xc - uVar46);
                  pdVar43 = (data_ptr_t)local_f8._8_8_;
                }
                else {
                  local_f8._4_4_ = *(undefined4 *)local_f8._8_8_;
                  pdVar43 = (data_ptr_t)local_f8._8_8_;
                }
                *(undefined8 *)((long)local_198 + lVar38 + -8) = local_f8._0_8_;
                *(data_ptr_t *)((long)local_198 + lVar38) = pdVar43;
                lVar38 = lVar38 + 0x10;
                local_178 = local_178 + -1;
              } while (local_178 != (data_ptr_t)0x0);
              return;
            }
            if (pdVar43 + 0x3f < (data_ptr_t)0x40) {
              return;
            }
            uVar46 = (ulong)(pdVar43 + 0x3f) >> 6;
            pdVar43 = (data_ptr_t)0x0;
            local_158 = 0;
            pVVar30 = local_170;
            local_168 = uVar46;
            do {
              puVar5 = (pVVar30->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                pdVar48 = pdVar43 + 0x40;
                if (local_178 <= pdVar43 + 0x40) {
                  pdVar48 = local_178;
                }
LAB_010e4333:
                pdVar45 = pdVar43;
                if (pdVar43 < pdVar48) {
                  uVar21 = (long)pdVar43 << 4 | 8;
                  do {
                    local_148 = *(undefined1 (*) [8])(local_190 + (uVar21 - 8));
                    pLStack_140 = *(pointer *)(local_190 + uVar21);
                    uVar46 = *(ulong *)((long)local_180 + (uVar21 - 8));
                    pLVar27 = pLStack_140;
                    if (SUB84(local_148,0) < 0xd) {
                      pLVar27 = (pointer)(local_148 + 4);
                    }
                    pLStack_1a0 = (pointer)*(undefined1 **)((long)local_180 + uVar21);
                    local_1a8 = (undefined1  [8])uVar46;
                    puVar44 = *(undefined1 **)((long)local_180 + uVar21);
                    if ((uint)uVar46 < 0xd) {
                      puVar44 = local_1a8 + 4;
                    }
                    uVar35 = (ulong)local_148 & 0xffffffff;
                    local_f8 = (undefined1  [16])
                               StringVector::EmptyString
                                         ((StringVector *)result,
                                          (Vector *)(uVar35 + (uVar46 & 0xffffffff)),
                                          (idx_t)(local_1a8 + 4));
                    pcVar40 = local_f8._8_8_;
                    if (local_f8._0_4_ < 0xd) {
                      pcVar40 = local_f8 + 4;
                    }
                    switchD_012b9b0d::default(pcVar40,pLVar27,uVar35);
                    switchD_012b9b0d::default(pcVar40 + uVar35,puVar44,uVar46 & 0xffffffff);
                    uVar46 = (ulong)(uint)local_f8._0_4_;
                    if (uVar46 < 0xd) {
                      switchD_012e3010::default(local_f8 + uVar46 + 4,0,0xc - uVar46);
                      pdVar45 = (data_ptr_t)local_f8._8_8_;
                    }
                    else {
                      local_f8._4_4_ = *(undefined4 *)local_f8._8_8_;
                      pdVar45 = (data_ptr_t)local_f8._8_8_;
                    }
                    *(undefined8 *)((long)local_198 + (uVar21 - 8)) = local_f8._0_8_;
                    *(data_ptr_t *)((long)local_198 + uVar21) = pdVar45;
                    pdVar43 = pdVar43 + 1;
                    uVar21 = uVar21 + 0x10;
                    pVVar30 = local_170;
                    uVar46 = local_168;
                    pdVar45 = pdVar48;
                  } while (pdVar48 != pdVar43);
                }
              }
              else {
                pLVar27 = (pointer)puVar5[local_158];
                pdVar48 = pdVar43 + 0x40;
                if (local_178 <= pdVar43 + 0x40) {
                  pdVar48 = local_178;
                }
                pdVar45 = pdVar48;
                if (pLVar27 != (pointer)0x0) {
                  if (pLVar27 == (pointer)0xffffffffffffffff) goto LAB_010e4333;
                  local_188 = (pointer)(pdVar48 + -(long)pdVar43);
                  pdVar45 = pdVar43;
                  if (pdVar43 <= pdVar48 && local_188 != (pointer)0x0) {
                    uVar21 = (long)pdVar43 << 4 | 8;
                    pSVar36 = (SelectionVector *)0x0;
                    local_160 = pLVar27;
                    do {
                      if (((ulong)pLVar27 >> ((ulong)pSVar36 & 0x3f) & 1) != 0) {
                        local_148 = *(undefined1 (*) [8])(local_190 + (uVar21 - 8));
                        pLStack_140 = *(pointer *)(local_190 + uVar21);
                        uVar46 = *(ulong *)((long)local_180 + (uVar21 - 8));
                        pLVar27 = pLStack_140;
                        if (SUB84(local_148,0) < 0xd) {
                          pLVar27 = (pointer)(local_148 + 4);
                        }
                        pLStack_1a0 = (pointer)*(undefined1 **)((long)local_180 + uVar21);
                        local_1a8 = (undefined1  [8])uVar46;
                        puVar44 = *(undefined1 **)((long)local_180 + uVar21);
                        if ((uint)uVar46 < 0xd) {
                          puVar44 = local_1a8 + 4;
                        }
                        uVar35 = (ulong)local_148 & 0xffffffff;
                        local_f8 = (undefined1  [16])
                                   StringVector::EmptyString
                                             ((StringVector *)result,
                                              (Vector *)((uVar46 & 0xffffffff) + uVar35),
                                              (idx_t)(local_1a8 + 4));
                        pcVar40 = local_f8._8_8_;
                        if (local_f8._0_4_ < 0xd) {
                          pcVar40 = local_f8 + 4;
                        }
                        switchD_012b9b0d::default(pcVar40,pLVar27,uVar35);
                        switchD_012b9b0d::default(pcVar40 + uVar35,puVar44,uVar46 & 0xffffffff);
                        uVar46 = (ulong)(uint)local_f8._0_4_;
                        if (uVar46 < 0xd) {
                          switchD_012e3010::default(local_f8 + uVar46 + 4,0,0xc - uVar46);
                          pdVar43 = (data_ptr_t)local_f8._8_8_;
                        }
                        else {
                          local_f8._4_4_ = *(undefined4 *)local_f8._8_8_;
                          pdVar43 = (data_ptr_t)local_f8._8_8_;
                        }
                        *(undefined8 *)((long)local_198 + (uVar21 - 8)) = local_f8._0_8_;
                        *(data_ptr_t *)((long)local_198 + uVar21) = pdVar43;
                        pLVar27 = local_160;
                      }
                      pSVar36 = (SelectionVector *)((long)&pSVar36->sel_vector + 1);
                      uVar21 = uVar21 + 0x10;
                      pVVar30 = local_170;
                      uVar46 = local_168;
                      pdVar45 = pdVar48;
                    } while (local_188 != (pointer)pSVar36);
                  }
                }
              }
              pdVar43 = pdVar45;
              local_158 = local_158 + 1;
              if (local_158 == uVar46) {
                return;
              }
            } while( true );
          }
          local_170 = (ValidityMask *)pvVar20->data;
          puVar5 = (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          local_190 = vector->data;
          if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
            Vector::SetVectorType(result,FLAT_VECTOR);
            local_180 = (pointer)result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(vector);
            FlatVector::VerifyFlatVector(result);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data)
            ;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (pdVar43 == (data_ptr_t)0x0) {
                return;
              }
              pLVar27 = *(pointer *)&local_170->super_TemplatedValidityMask<unsigned_long>;
              local_198 = *(pointer *)
                           ((long)&local_170->super_TemplatedValidityMask<unsigned_long> + 8);
              pLVar33 = (pointer)(local_148 + 4);
              if (0xc < (uint)pLVar27) {
                pLVar33 = local_198;
              }
              uVar46 = (ulong)pLVar27 & 0xffffffff;
              lVar38 = 8;
              pLVar32 = pLVar33;
              do {
                uVar21 = *(ulong *)(local_190 + lVar38 + -8);
                pLStack_140 = local_198;
                pLStack_1a0 = (pointer)*(undefined1 **)(local_190 + lVar38);
                local_1a8 = (undefined1  [8])uVar21;
                puVar44 = *(undefined1 **)(local_190 + lVar38);
                if ((uint)uVar21 < 0xd) {
                  puVar44 = local_1a8 + 4;
                }
                local_148 = (undefined1  [8])pLVar27;
                local_f8 = (undefined1  [16])
                           StringVector::EmptyString
                                     ((StringVector *)result,
                                      (Vector *)((uVar21 & 0xffffffff) + uVar46),(idx_t)pLVar32);
                pcVar40 = local_f8._8_8_;
                if (local_f8._0_4_ < 0xd) {
                  pcVar40 = local_f8 + 4;
                }
                switchD_012b9b0d::default(pcVar40,pLVar33,uVar46);
                switchD_012b9b0d::default(pcVar40 + uVar46,puVar44,uVar21 & 0xffffffff);
                uVar21 = (ulong)(uint)local_f8._0_4_;
                if (uVar21 < 0xd) {
                  switchD_012e3010::default(local_f8 + 4 + uVar21,0,0xc - uVar21);
                  pdVar43 = (data_ptr_t)local_f8._8_8_;
                }
                else {
                  local_f8._4_4_ = *(undefined4 *)local_f8._8_8_;
                  pdVar43 = (data_ptr_t)local_f8._8_8_;
                }
                *(undefined8 *)((long)local_180 + lVar38 + -8) = local_f8._0_8_;
                *(data_ptr_t *)
                 ((long)&((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           *)&(local_180->vdata).sel)->_M_ptr + lVar38) = pdVar43;
                lVar38 = lVar38 + 0x10;
                local_178 = local_178 + -1;
                pLVar32 = local_180;
              } while (local_178 != (data_ptr_t)0x0);
              return;
            }
            if (pdVar43 + 0x3f < (data_ptr_t)0x40) {
              return;
            }
            uVar46 = (ulong)(pdVar43 + 0x3f) >> 6;
            pdVar43 = (data_ptr_t)0x0;
            local_168 = 0;
            local_150 = uVar46;
            do {
              puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                local_198 = (pointer)(pdVar43 + 0x40);
                if (local_178 <= pdVar43 + 0x40) {
                  local_198 = (pointer)local_178;
                }
LAB_010e3e3b:
                pLVar33 = (pointer)pdVar43;
                if (pdVar43 < local_198) {
                  pLVar27 = *(pointer *)&local_170->super_TemplatedValidityMask<unsigned_long>;
                  local_188 = *(pointer *)
                               ((long)&local_170->super_TemplatedValidityMask<unsigned_long> + 8);
                  local_160 = local_188;
                  if ((uint)pLVar27 < 0xd) {
                    local_160 = (pointer)(local_148 + 4);
                  }
                  local_158 = (ulong)pLVar27 & 0xffffffff;
                  uVar21 = (long)pdVar43 << 4 | 8;
                  pLVar32 = local_160;
                  do {
                    sVar12 = local_158;
                    uVar46 = *(ulong *)(local_190 + (uVar21 - 8));
                    pLStack_140 = local_188;
                    pLStack_1a0 = (pointer)*(undefined1 **)(local_190 + uVar21);
                    local_1a8 = (undefined1  [8])uVar46;
                    puVar44 = *(undefined1 **)(local_190 + uVar21);
                    if ((uint)uVar46 < 0xd) {
                      puVar44 = local_1a8 + 4;
                    }
                    local_148 = (undefined1  [8])pLVar27;
                    local_f8 = (undefined1  [16])
                               StringVector::EmptyString
                                         ((StringVector *)result,
                                          (Vector *)((uVar46 & 0xffffffff) + local_158),
                                          (idx_t)pLVar32);
                    pcVar40 = local_f8._8_8_;
                    if (local_f8._0_4_ < 0xd) {
                      pcVar40 = local_f8 + 4;
                    }
                    switchD_012b9b0d::default(pcVar40,local_160,sVar12);
                    switchD_012b9b0d::default(pcVar40 + sVar12,puVar44,uVar46 & 0xffffffff);
                    uVar46 = (ulong)(uint)local_f8._0_4_;
                    if (uVar46 < 0xd) {
                      switchD_012e3010::default(local_f8 + 4 + uVar46,0,0xc - uVar46);
                      pdVar48 = (data_ptr_t)local_f8._8_8_;
                    }
                    else {
                      local_f8._4_4_ = *(undefined4 *)local_f8._8_8_;
                      pdVar48 = (data_ptr_t)local_f8._8_8_;
                    }
                    *(undefined8 *)((long)local_180 + (uVar21 - 8)) = local_f8._0_8_;
                    *(data_ptr_t *)
                     ((long)&((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               *)&(local_180->vdata).sel)->_M_ptr + uVar21) = pdVar48;
                    pdVar43 = pdVar43 + 1;
                    uVar21 = uVar21 + 0x10;
                    uVar46 = local_150;
                    pLVar32 = local_180;
                    pLVar33 = local_198;
                  } while (local_198 != (pointer)pdVar43);
                }
              }
              else {
                pLVar27 = (pointer)puVar5[local_168];
                local_198 = (pointer)(pdVar43 + 0x40);
                if (local_178 <= pdVar43 + 0x40) {
                  local_198 = (pointer)local_178;
                }
                pLVar33 = local_198;
                if (pLVar27 != (pointer)0x0) {
                  if (pLVar27 == (pointer)0xffffffffffffffff) goto LAB_010e3e3b;
                  uVar21 = (long)local_198 - (long)pdVar43;
                  pLVar33 = (pointer)pdVar43;
                  if (pdVar43 < local_198) {
                    uVar35 = (long)pdVar43 << 4 | 8;
                    uVar42 = 0;
                    local_188 = pLVar27;
                    do {
                      if (((ulong)pLVar27 >> (uVar42 & 0x3f) & 1) != 0) {
                        local_148 = *(undefined1 (*) [8])
                                     &local_170->super_TemplatedValidityMask<unsigned_long>;
                        pLStack_140 = *(pointer *)
                                       ((long)&local_170->super_TemplatedValidityMask<unsigned_long>
                                       + 8);
                        uVar46 = *(ulong *)(local_190 + (uVar35 - 8));
                        pLVar27 = pLStack_140;
                        if (SUB84(local_148,0) < 0xd) {
                          pLVar27 = (pointer)(local_148 + 4);
                        }
                        pLStack_1a0 = (pointer)*(undefined1 **)(local_190 + uVar35);
                        local_1a8 = (undefined1  [8])uVar46;
                        puVar44 = *(undefined1 **)(local_190 + uVar35);
                        if ((uint)uVar46 < 0xd) {
                          puVar44 = local_1a8 + 4;
                        }
                        uVar50 = (ulong)local_148 & 0xffffffff;
                        local_f8 = (undefined1  [16])
                                   StringVector::EmptyString
                                             ((StringVector *)result,
                                              (Vector *)((uVar46 & 0xffffffff) + uVar50),
                                              (idx_t)(local_1a8 + 4));
                        pcVar40 = local_f8._8_8_;
                        if (local_f8._0_4_ < 0xd) {
                          pcVar40 = local_f8 + 4;
                        }
                        switchD_012b9b0d::default(pcVar40,pLVar27,uVar50);
                        switchD_012b9b0d::default(pcVar40 + uVar50,puVar44,uVar46 & 0xffffffff);
                        uVar46 = (ulong)(uint)local_f8._0_4_;
                        if (uVar46 < 0xd) {
                          switchD_012e3010::default(local_f8 + uVar46 + 4,0,0xc - uVar46);
                          pdVar43 = (data_ptr_t)local_f8._8_8_;
                        }
                        else {
                          local_f8._4_4_ = *(undefined4 *)local_f8._8_8_;
                          pdVar43 = (data_ptr_t)local_f8._8_8_;
                        }
                        *(undefined8 *)((long)local_180 + (uVar35 - 8)) = local_f8._0_8_;
                        *(data_ptr_t *)
                         ((long)&((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                   *)&(local_180->vdata).sel)->_M_ptr + uVar35) = pdVar43;
                        pLVar27 = local_188;
                      }
                      uVar42 = uVar42 + 1;
                      uVar35 = uVar35 + 0x10;
                      uVar46 = local_150;
                      pLVar33 = local_198;
                    } while (uVar21 != uVar42);
                  }
                }
              }
              pdVar43 = (data_ptr_t)pLVar33;
              local_168 = local_168 + 1;
              if (local_168 == uVar46) {
                return;
              }
            } while( true );
          }
        }
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
      ConstantVector::SetNull(result,true);
      return;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_f8._8_8_;
    local_f8 = auVar11 << 0x40;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_148,args->count,
               (value_type_conflict *)local_f8,(allocator_type *)local_1a8);
    pVVar23 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pVVar23 ==
        (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_190 = (data_ptr_t)0x0;
      pVVar29 = pVVar23;
    }
    else {
      local_190 = (data_ptr_t)0x0;
      sVar47 = 0;
      do {
        pvVar20 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar47);
        if (pvVar20->vector_type == CONSTANT_VECTOR) {
          puVar5 = (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
            local_190 = local_190 + *(uint *)pvVar20->data;
          }
        }
        else {
          Vector::SetVectorType(result,FLAT_VECTOR);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_f8);
          Vector::ToUnifiedFormat(pvVar20,args->count,(UnifiedVectorFormat *)local_f8);
          uVar46 = args->count;
          if (uVar46 != 0) {
            uVar13 = local_f8._8_8_;
            sVar51 = 0;
            do {
              sVar28 = sVar51;
              if (*(sel_t **)local_f8._0_8_ != (sel_t *)0x0) {
                sVar28 = (size_type)(*(sel_t **)local_f8._0_8_)[sVar51];
              }
              if ((local_e8 == (unsigned_long *)0x0) ||
                 ((local_e8[sVar28 >> 6] >> (sVar28 & 0x3f) & 1) != 0)) {
                uVar37 = *(uint *)(uVar13 + sVar28 * 0x10);
                pvVar22 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)local_148,sVar51);
                *pvVar22 = *pvVar22 + (ulong)uVar37;
                uVar46 = args->count;
              }
              sVar51 = sVar51 + 1;
            } while (sVar51 < uVar46);
          }
          if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
          }
          if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
          }
        }
        sVar47 = sVar47 + 1;
        pVVar23 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pVVar29 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      } while (sVar47 < (ulong)(((long)pVVar29 - (long)pVVar23 >> 3) * 0x4ec4ec4ec4ec4ec5));
    }
    pLVar27 = (pointer)result->data;
    if (args->count == 0) {
      uVar46 = 0;
    }
    else {
      pdVar43 = (data_ptr_t)((long)pLVar27 + 8);
      sVar51 = 0;
      do {
        pvVar22 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)local_148,sVar51);
        sVar52 = StringVector::EmptyString
                           ((StringVector *)result,(Vector *)(local_190 + *pvVar22),len);
        *(long *)(pdVar43 + -8) = sVar52.value._0_8_;
        *(long *)pdVar43 = sVar52.value._8_8_;
        pvVar22 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)local_148,sVar51);
        *pvVar22 = 0;
        sVar51 = sVar51 + 1;
        uVar46 = args->count;
        pdVar43 = pdVar43 + 0x10;
      } while (sVar51 < uVar46);
      pVVar23 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar29 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    if (pVVar29 != pVVar23) {
      sVar47 = 0;
      local_198 = pLVar27;
      do {
        pvVar20 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar47);
        local_180 = (pointer)sVar47;
        if (pvVar20->vector_type == CONSTANT_VECTOR) {
          puVar5 = (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
            puVar24 = (uint *)pvVar20->data;
            uVar46 = (ulong)*puVar24;
            if (uVar46 < 0xd) {
              puVar24 = puVar24 + 1;
            }
            else {
              puVar24 = *(uint **)(puVar24 + 2);
            }
            if (args->count != 0) {
              sVar51 = 0;
              pdVar43 = (data_ptr_t)((long)pLVar27 + 4);
              do {
                uVar37 = *(uint *)(pdVar43 + -4);
                pdVar48 = *(data_ptr_t *)(pdVar43 + 4);
                pvVar22 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)local_148,sVar51);
                if (uVar37 < 0xd) {
                  pdVar48 = pdVar43;
                }
                switchD_012b9b0d::default(pdVar48 + *pvVar22,puVar24,uVar46);
                pvVar22 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)local_148,sVar51);
                *pvVar22 = *pvVar22 + uVar46;
                sVar51 = sVar51 + 1;
                pdVar43 = pdVar43 + 0x10;
              } while (sVar51 < args->count);
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_f8);
          Vector::ToUnifiedFormat(pvVar20,args->count,(UnifiedVectorFormat *)local_f8);
          uVar46 = args->count;
          if (uVar46 != 0) {
            sVar51 = 0;
            local_190 = (data_ptr_t)local_f8._8_8_;
            pdVar43 = (data_ptr_t)local_f8._8_8_;
            pdVar48 = (data_ptr_t)((long)pLVar27 + 4);
            do {
              sVar28 = sVar51;
              if (*(sel_t **)local_f8._0_8_ != (sel_t *)0x0) {
                sVar28 = (size_type)(*(sel_t **)local_f8._0_8_)[sVar51];
              }
              if ((local_e8 == (unsigned_long *)0x0) ||
                 ((local_e8[sVar28 >> 6] >> (sVar28 & 0x3f) & 1) != 0)) {
                lVar38 = sVar28 * 0x10;
                uVar37 = *(uint *)(pdVar43 + lVar38);
                pdVar43 = *(data_ptr_t *)(pdVar43 + lVar38 + 8);
                uVar49 = *(uint *)(pdVar48 + -4);
                pdVar45 = *(data_ptr_t *)(pdVar48 + 4);
                pvVar22 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)local_148,sVar51);
                if (uVar49 < 0xd) {
                  pdVar45 = pdVar48;
                }
                if (uVar37 < 0xd) {
                  pdVar43 = local_190 + lVar38 + 4;
                }
                switchD_012b9b0d::default(pdVar45 + *pvVar22,pdVar43,(ulong)uVar37);
                pvVar22 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)local_148,sVar51);
                *pvVar22 = *pvVar22 + (ulong)uVar37;
                uVar46 = args->count;
                pdVar43 = local_190;
              }
              sVar51 = sVar51 + 1;
              pdVar48 = pdVar48 + 0x10;
            } while (sVar51 < uVar46);
          }
          if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
          }
          if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
          }
        }
        sVar47 = (long)local_180 + 1;
      } while (sVar47 < (ulong)(((long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
      uVar46 = args->count;
      pLVar27 = local_198;
    }
    if (uVar46 != 0) {
      pdVar43 = (data_ptr_t)((long)pLVar27 + 4);
      uVar46 = 0;
      do {
        uVar21 = (ulong)*(uint *)(pdVar43 + -4);
        if (uVar21 < 0xd) {
          switchD_012e3010::default(pdVar43 + uVar21,0,0xc - uVar21);
        }
        else {
          *(undefined4 *)pdVar43 = **(undefined4 **)(pdVar43 + 4);
        }
        uVar46 = uVar46 + 1;
        pdVar43 = pdVar43 + 0x10;
      } while (uVar46 < args->count);
    }
    if (local_148 != (undefined1  [8])0x0) {
      operator_delete((void *)local_148);
    }
  }
  return;
}

Assistant:

static void ConcatFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ConcatFunctionData>();
	if (info.return_type.id() == LogicalTypeId::LIST) {
		return ListConcatFunction(args, state, result, info.is_operator);
	} else if (info.is_operator) {
		return ConcatOperator(args, state, result);
	}
	return StringConcatFunction(args, state, result);
}